

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  byte bVar1;
  bool bVar2;
  object oVar3;
  int iVar4;
  object *poVar5;
  internals *piVar6;
  _Fwd_list_node_base *p_Var7;
  size_t sVar8;
  void *__dest;
  long lVar9;
  PyObject *pPVar10;
  error_already_set *this;
  long *plVar11;
  handle *phVar12;
  size_type *psVar13;
  object *object;
  PyObject *pPVar14;
  PyTypeObject *pPVar15;
  handle hVar16;
  PyTypeObject *type;
  string local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  handle local_a8;
  handle local_a0;
  long local_98;
  PyObject local_90;
  object local_80;
  object local_78;
  object qualname;
  object name;
  handle local_60;
  tuple bases;
  handle local_50;
  undefined1 local_48 [16];
  handle local_38;
  object module;
  
  local_78.super_handle.m_ptr = (handle)PyUnicode_FromString(rec->name);
  if (local_78.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_78.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_78.super_handle.m_ptr)->ob_refcnt + 1;
  }
  pPVar14 = (rec->scope).m_ptr;
  qualname.super_handle.m_ptr = local_78.super_handle.m_ptr;
  if (pPVar14 == (PyObject *)0x0) {
    local_38.m_ptr = (PyObject *)0x0;
LAB_00112a4b:
    std::__cxx11::string::string((string *)&bases,rec->name,(allocator *)&local_a0);
    bVar2 = false;
  }
  else {
    if (pPVar14->ob_type != (PyTypeObject *)&PyModule_Type) {
      iVar4 = PyType_IsSubtype(pPVar14->ob_type,&PyModule_Type);
      pPVar14 = (rec->scope).m_ptr;
      if (iVar4 == 0) {
        iVar4 = PyObject_HasAttrString(pPVar14,"__qualname__");
        pPVar10 = (rec->scope).m_ptr;
        pPVar14 = pPVar10;
        if (iVar4 == 1) {
          local_48._0_8_ = "__qualname__";
          local_48._8_8_ = (PyObject *)0x0;
          poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                             ((accessor<pybind11::detail::accessor_policies::str_attr> *)&bases);
          local_a0.m_ptr =
               (PyObject *)
               PyUnicode_FromFormat
                         ("%U.%U",(poVar5->super_handle).m_ptr,qualname.super_handle.m_ptr);
          pybind11::object::operator=(&local_78,(object *)&local_a0);
          pybind11::object::~object((object *)&local_a0);
          pybind11::object::~object((object *)(local_48 + 8));
          pPVar14 = (rec->scope).m_ptr;
          local_50.m_ptr = pPVar10;
        }
      }
      local_38.m_ptr = (PyObject *)0x0;
      if (pPVar14 == (PyObject *)0x0) goto LAB_00112a4b;
    }
    local_38.m_ptr = (PyObject *)0x0;
    iVar4 = PyObject_HasAttrString(pPVar14,"__module__");
    if (iVar4 == 1) {
      local_50.m_ptr = (rec->scope).m_ptr;
      local_48._0_8_ = "__module__";
      local_48._8_8_ = (PyObject *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)&bases);
LAB_001129b2:
      local_a0.m_ptr = (poVar5->super_handle).m_ptr;
      if (local_a0.m_ptr != (PyObject *)0x0) {
        (local_a0.m_ptr)->ob_refcnt = (local_a0.m_ptr)->ob_refcnt + 1;
      }
      pybind11::object::operator=((object *)&local_38,(object *)&local_a0);
      pybind11::object::~object((object *)&local_a0);
      pybind11::object::~object((object *)(local_48 + 8));
    }
    else {
      iVar4 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar4 == 1) {
        local_50.m_ptr = (rec->scope).m_ptr;
        local_48._0_8_ = "__name__";
        local_48._8_8_ = (PyObject *)0x0;
        poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)&bases);
        goto LAB_001129b2;
      }
    }
    if (local_38.m_ptr == (PyObject *)0x0) goto LAB_00112a4b;
    str::str((str *)&local_80,(object *)&local_38);
    cast<std::__cxx11::string>(&local_108,(pybind11 *)&local_80,object);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_a0.m_ptr = &local_90;
    pPVar14 = (PyObject *)(plVar11 + 2);
    if ((PyObject *)*plVar11 == pPVar14) {
      local_90.ob_refcnt = pPVar14->ob_refcnt;
      local_90.ob_type = (PyTypeObject *)plVar11[3];
    }
    else {
      local_90.ob_refcnt = pPVar14->ob_refcnt;
      local_a0.m_ptr = (PyObject *)*plVar11;
    }
    local_98 = plVar11[1];
    *plVar11 = (long)pPVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    phVar12 = (handle *)std::__cxx11::string::append((char *)&local_a0);
    bases.super_object.super_handle.m_ptr = (object)local_48;
    hVar16.m_ptr = (PyObject *)(phVar12 + 2);
    if (phVar12->m_ptr == hVar16.m_ptr) {
      local_48._0_8_ = (hVar16.m_ptr)->ob_refcnt;
      local_48._8_8_ = phVar12[3].m_ptr;
    }
    else {
      local_48._0_8_ = (hVar16.m_ptr)->ob_refcnt;
      bases.super_object.super_handle.m_ptr = (object)(object)phVar12->m_ptr;
    }
    local_50.m_ptr = phVar12[1].m_ptr;
    phVar12->m_ptr = hVar16.m_ptr;
    phVar12[1].m_ptr = (PyObject *)0x0;
    *(undefined1 *)&phVar12[2].m_ptr = 0;
    bVar2 = true;
  }
  piVar6 = get_internals();
  p_Var7 = (_Fwd_list_node_base *)operator_new(0x28);
  p_Var7->_M_next = (_Fwd_list_node_base *)0x0;
  hVar16.m_ptr = (PyObject *)(p_Var7 + 3);
  p_Var7[1]._M_next = (_Fwd_list_node_base *)hVar16.m_ptr;
  if (bases.super_object.super_handle.m_ptr == (object)local_48) {
    (((PyVarObject *)&(hVar16.m_ptr)->ob_refcnt)->ob_base).ob_refcnt = local_48._0_8_;
    p_Var7[4]._M_next = (_Fwd_list_node_base *)local_48._8_8_;
  }
  else {
    p_Var7[1]._M_next = (_Fwd_list_node_base *)bases.super_object.super_handle.m_ptr;
    p_Var7[3]._M_next = (_Fwd_list_node_base *)local_48._0_8_;
    hVar16.m_ptr = (PyObject *)bases;
  }
  p_Var7[2]._M_next = (_Fwd_list_node_base *)local_50.m_ptr;
  local_48._0_8_ = local_48._0_8_ & 0xffffffffffffff00;
  p_Var7->_M_next =
       (piVar6->static_strings).
       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_head._M_next;
  (piVar6->static_strings).
  super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_head._M_next = p_Var7;
  bases.super_object.super_handle.m_ptr = (object)(object)local_48;
  if (bVar2) {
    if (local_a0.m_ptr != &local_90) {
      operator_delete(local_a0.m_ptr,local_90.ob_refcnt + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    pybind11::object::~object(&local_80);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar8 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar8 + 1);
    memcpy(__dest,rec->doc,sVar8 + 1);
  }
  piVar6 = get_internals();
  tuple::tuple((tuple *)&local_60,&(rec->bases).super_object);
  lVar9 = PyTuple_Size(local_60.m_ptr);
  if (lVar9 == 0) {
    pPVar14 = piVar6->instance_base;
  }
  else {
    local_48._0_8_ = (key_type)0x0;
    local_48._8_8_ = (PyObject *)0x0;
    local_a8.m_ptr = hVar16.m_ptr;
    poVar5 = accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                       ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&bases);
    pPVar14 = (poVar5->super_handle).m_ptr;
    pybind11::object::~object((object *)(local_48 + 8));
    hVar16.m_ptr = local_a8.m_ptr;
  }
  pPVar15 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar15 == (PyTypeObject *)0x0) {
    pPVar15 = piVar6->default_metaclass;
  }
  pPVar10 = (*pPVar15->tp_alloc)(pPVar15,0);
  oVar3 = qualname;
  if (pPVar10 == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_e8,rec->name,(allocator *)&local_c8);
    phVar12 = (handle *)std::__cxx11::string::append((char *)&local_e8);
    bases.super_object.super_handle.m_ptr = (object)phVar12->m_ptr;
    hVar16.m_ptr = (PyObject *)(phVar12 + 2);
    if (bases.super_object.super_handle.m_ptr == (object)hVar16.m_ptr) {
      local_48._0_8_ = (hVar16.m_ptr)->ob_refcnt;
      local_48._8_8_ = phVar12[3].m_ptr;
      bases.super_object.super_handle.m_ptr = (object)(object)local_48;
    }
    else {
      local_48._0_8_ = (hVar16.m_ptr)->ob_refcnt;
    }
    phVar12->m_ptr = hVar16.m_ptr;
    phVar12[1].m_ptr = (PyObject *)0x0;
    *(undefined1 *)&phVar12[2].m_ptr = 0;
    pybind11_fail((string *)&bases);
  }
  qualname.super_handle.m_ptr = (handle)(PyObject *)0x0;
  pPVar10[0x35].ob_refcnt = (Py_ssize_t)oVar3.super_handle.m_ptr;
  if (local_78.super_handle.m_ptr != (PyObject *)0x0) {
    *(long *)local_78.super_handle.m_ptr = *(long *)local_78.super_handle.m_ptr + 1;
  }
  pPVar10[0x36].ob_refcnt = (Py_ssize_t)local_78.super_handle.m_ptr;
  pPVar10[1].ob_type = (PyTypeObject *)hVar16.m_ptr;
  pPVar10[0xb].ob_refcnt = (Py_ssize_t)__dest;
  pPVar14->ob_refcnt = pPVar14->ob_refcnt + 1;
  pPVar10[0x10].ob_refcnt = (Py_ssize_t)pPVar14;
  pPVar10[2].ob_refcnt = 0x38;
  lVar9 = PyTuple_Size(local_60.m_ptr);
  hVar16.m_ptr = local_60.m_ptr;
  if (lVar9 != 0) {
    local_60.m_ptr = (PyObject *)0x0;
    pPVar10[0x15].ob_refcnt = (Py_ssize_t)hVar16.m_ptr;
  }
  pPVar10[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar10[6].ob_refcnt = (Py_ssize_t)&pPVar10[0x1b].ob_type;
  pPVar10[6].ob_type = (PyTypeObject *)(pPVar10 + 0x2f);
  pPVar10[7].ob_refcnt = (Py_ssize_t)&pPVar10[0x2d].ob_type;
  pPVar10[5].ob_refcnt = (Py_ssize_t)&pPVar10[0x19].ob_type;
  pPVar15 = pPVar10[10].ob_type;
  pPVar10[10].ob_type = (PyTypeObject *)((ulong)pPVar15 | 0x600);
  bVar1 = rec->field_0x60;
  if ((bVar1 & 2) != 0) {
    pPVar10[10].ob_type = (PyTypeObject *)((ulong)pPVar15 | 0x4600);
    pPVar10[0x12].ob_refcnt = pPVar10[2].ob_refcnt;
    pPVar10[2].ob_refcnt = pPVar10[2].ob_refcnt + 8;
    pPVar10[0xb].ob_type = (PyTypeObject *)pybind11_traverse;
    pPVar10[0xc].ob_refcnt = (Py_ssize_t)pybind11_clear;
    pPVar10[0xf].ob_type = (PyTypeObject *)enable_dynamic_attributes(_heaptypeobject*)::getset;
    bVar1 = rec->field_0x60;
  }
  if ((bVar1 & 4) != 0) {
    pPVar10[10].ob_refcnt = (Py_ssize_t)(pPVar10 + 0x34);
    pPVar10[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    pPVar10[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar4 = PyType_Ready(pPVar10);
  if (iVar4 < 0) {
    std::__cxx11::string::string
              (local_148,rec->name,(allocator *)((long)&name.super_handle.m_ptr + 7));
    plVar11 = (long *)std::__cxx11::string::append((char *)local_148);
    local_c8._M_dataplus._M_p = (pointer)*plVar11;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_c8._M_dataplus._M_p == psVar13) {
      local_c8.field_2._M_allocated_capacity = *psVar13;
      local_c8.field_2._8_8_ = plVar11[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar13;
    }
    local_c8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+(&local_e8,&local_c8,&local_128);
    phVar12 = (handle *)std::__cxx11::string::append((char *)&local_e8);
    bases.super_object.super_handle.m_ptr = (object)phVar12->m_ptr;
    hVar16.m_ptr = (PyObject *)(phVar12 + 2);
    if (bases.super_object.super_handle.m_ptr == (object)hVar16.m_ptr) {
      local_48._0_8_ = (hVar16.m_ptr)->ob_refcnt;
      local_48._8_8_ = phVar12[3].m_ptr;
      bases.super_object.super_handle.m_ptr = (object)(object)local_48;
    }
    else {
      local_48._0_8_ = (hVar16.m_ptr)->ob_refcnt;
    }
    phVar12->m_ptr = hVar16.m_ptr;
    phVar12[1].m_ptr = (PyObject *)0x0;
    *(undefined1 *)&phVar12[2].m_ptr = 0;
    pybind11_fail((string *)&bases);
  }
  if (((rec->field_0x60 & 2) == 0) != (((ulong)pPVar10[10].ob_type & 0x4000) == 0)) {
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CRPropa[P]sophia_next/lib/pybind11/include/pybind11/detail/class.h"
                  ,0x26e,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar14 = (rec->scope).m_ptr;
  if (pPVar14 == (PyObject *)0x0) {
    pPVar10->ob_refcnt = pPVar10->ob_refcnt + 1;
  }
  else {
    iVar4 = PyObject_SetAttrString(pPVar14,rec->name,pPVar10);
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_00112f2e;
    }
  }
  if ((local_38.m_ptr == (PyObject *)0x0) ||
     (iVar4 = PyObject_SetAttrString(pPVar10,"__module__"), iVar4 == 0)) {
    pybind11::object::~object((object *)&local_60);
    pybind11::object::~object((object *)&local_38);
    pybind11::object::~object(&local_78);
    pybind11::object::~object(&qualname);
    return pPVar10;
  }
  this = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this);
LAB_00112f2e:
  __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
#if PY_MAJOR_VERSION >= 3
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
#else
        qualname = str(rec.scope.attr("__qualname__").cast<std::string>() + "." + rec.name);
#endif
    }

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

    auto full_name = c_str(
#if !defined(PYPY_VERSION)
        module ? str(module).cast<std::string>() + "." + rec.name :
#endif
        rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *)base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
#if PY_VERSION_HEX >= 0x03050000
    type->tp_as_async = &heap_type->as_async;
#endif

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);
    else
        Py_INCREF(type); // Keep it alive forever (reference leak)

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}